

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

int Bac_NtkDeriveFromPtr(Bac_Ntk_t *pNtk,Vec_Ptr_t *vNtk,Vec_Int_t *vMap,Vec_Int_t *vBox2Id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bac_ObjType_t Type;
  char *pStr;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  char *pcVar6;
  char *pStr_00;
  Bac_Ntk_t *p_01;
  bool bVar7;
  int NtkId;
  int nInputs;
  int nOutputs;
  char *pBoxName;
  char *pBoxNtk;
  int local_70;
  int NameId;
  int iTerm;
  int iObj;
  int k;
  int i;
  Vec_Ptr_t *vBox;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *vOutputs;
  Vec_Ptr_t *vInputs;
  char *pModuleName;
  char *pName;
  Vec_Int_t *vBox2Id_local;
  Vec_Int_t *vMap_local;
  Vec_Ptr_t *vNtk_local;
  Bac_Ntk_t *pNtk_local;
  
  pStr = (char *)Vec_PtrEntry(vNtk,0);
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  p = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  p_00 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
  iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pStr,(int *)0x0);
  iVar2 = Bac_NtkNameId(pNtk);
  if (iVar2 != iVar1) {
    __assert_fail("Bac_NtkNameId(pNtk) == NameId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x11d,
                  "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (iObj = 0; iVar1 = Vec_PtrSize(pVVar5), iObj < iVar1; iObj = iObj + 1) {
    pcVar6 = (char *)Vec_PtrEntry(pVVar5,iObj);
    iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar6,(int *)0x0);
    iVar2 = Vec_IntGetEntryFull(vMap,iVar1);
    if (iVar2 != -1) {
      printf("PI with name \"%s\" is not unique module \"%s\".\n",pcVar6,pStr);
      return 0;
    }
    iVar2 = Bac_ObjAlloc(pNtk,BAC_OBJ_PI,-1);
    iVar3 = Abc_Var2Lit2(iVar1,0);
    Bac_ObjSetName(pNtk,iVar2,iVar3);
    Vec_IntSetEntryFull(vMap,iVar1,iVar2);
    iVar1 = Abc_Var2Lit2(iVar1,1);
    Bac_NtkAddInfo(pNtk,iVar1,-1,-1);
  }
  Vec_IntClear(vBox2Id);
  for (iObj = 0; iVar1 = Vec_PtrSize(p_00), iObj < iVar1; iObj = iObj + 1) {
    pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,iObj);
    pcVar6 = (char *)Vec_PtrEntry(pVVar5,0);
    pStr_00 = (char *)Vec_PtrEntry(pVVar5,1);
    iVar1 = Bac_BoxCountOutputs(pNtk,pcVar6);
    iVar2 = Vec_PtrSize(pVVar5);
    iVar3 = Bac_ManNtkFindId(pNtk->pDesign,pcVar6);
    iVar4 = Vec_PtrSize(pVVar5);
    if (iVar4 % 2 != 0) {
      __assert_fail("Vec_PtrSize(vBox) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x132,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if ((iVar1 < 1) || (iVar4 = Vec_PtrSize(pVVar5), iVar4 < (iVar1 + 1) * 2)) {
      __assert_fail("nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x133,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    Type = Ptr_NameToType(pcVar6);
    iVar2 = Bac_BoxAlloc(pNtk,Type,(iVar2 / 2 - iVar1) + -1,iVar1,iVar3);
    if (0 < iVar3) {
      p_01 = Bac_ManNtk(pNtk->pDesign,iVar3);
      iVar3 = Bac_NtkId(pNtk);
      Bac_NtkSetHost(p_01,iVar3,iVar2);
    }
    iVar3 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pStr_00,(int *)0x0);
    iVar3 = Abc_Var2Lit2(iVar3,0);
    Bac_ObjSetName(pNtk,iVar2,iVar3);
    iTerm = 0;
    local_70 = iVar2;
    while( true ) {
      local_70 = local_70 + 1;
      iVar3 = Bac_NtkObjNum(pNtk);
      bVar7 = false;
      if (local_70 < iVar3) {
        iVar3 = Bac_ObjIsBo(pNtk,local_70);
        bVar7 = iVar3 != 0;
      }
      if (!bVar7) break;
      iVar3 = Vec_PtrSize(pVVar5);
      pcVar6 = (char *)Vec_PtrEntry(pVVar5,iVar3 + (iVar1 - iTerm) * -2 + 1);
      iVar3 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar6,(int *)0x0);
      iVar4 = Vec_IntGetEntryFull(vMap,iVar3);
      if (iVar4 != -1) {
        printf("Signal \"%s\" has multiple drivers in module \"%s\".\n",pcVar6,pStr);
        return 0;
      }
      iVar4 = Abc_Var2Lit2(iVar3,0);
      Bac_ObjSetName(pNtk,local_70,iVar4);
      Vec_IntSetEntryFull(vMap,iVar3,local_70);
      iTerm = iTerm + 1;
    }
    Vec_IntPush(vBox2Id,iVar2);
  }
  iVar1 = Vec_IntSize(vBox2Id);
  iVar2 = Vec_PtrSize(p_00);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x143,
                  "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (iObj = 0; iVar1 = Vec_PtrSize(p_00), iObj < iVar1; iObj = iObj + 1) {
    pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,iObj);
    local_70 = Vec_IntEntry(vBox2Id,iObj);
    iTerm = 0;
    while( true ) {
      local_70 = local_70 + -1;
      bVar7 = false;
      if (-1 < local_70) {
        iVar1 = Bac_ObjIsBi(pNtk,local_70);
        bVar7 = iVar1 != 0;
      }
      if (!bVar7) break;
      pcVar6 = (char *)Vec_PtrEntry(pVVar5,(iTerm + 1) * 2 + 1);
      iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar6,(int *)0x0);
      iVar2 = Vec_IntGetEntryFull(vMap,iVar1);
      if (iVar2 == -1) {
        printf("Signal \"%s\" in not driven in module \"%s\".\n",pcVar6,pStr);
      }
      iVar1 = Vec_IntGetEntryFull(vMap,iVar1);
      Bac_ObjSetFanin(pNtk,local_70,iVar1);
      iTerm = iTerm + 1;
    }
  }
  for (iObj = 0; iVar1 = Vec_PtrSize(p), iObj < iVar1; iObj = iObj + 1) {
    pcVar6 = (char *)Vec_PtrEntry(p,iObj);
    iVar1 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar6,(int *)0x0);
    iVar2 = Vec_IntGetEntryFull(vMap,iVar1);
    if (iVar2 == -1) {
      printf("PO with name \"%s\" in not driven in module \"%s\".\n",pcVar6,pStr);
    }
    iVar2 = Vec_IntGetEntryFull(vMap,iVar1);
    Bac_ObjAlloc(pNtk,BAC_OBJ_PO,iVar2);
    iVar1 = Abc_Var2Lit2(iVar1,2);
    Bac_NtkAddInfo(pNtk,iVar1,-1,-1);
  }
  for (NameId = 0; iVar1 = Bac_NtkObjNum(pNtk), NameId < iVar1; NameId = NameId + 1) {
    iVar1 = Bac_ObjIsCi(pNtk,NameId);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjNameId(pNtk,NameId);
      Vec_IntSetEntryFull(vMap,iVar1,-1);
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vMap), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vMap,iObj);
    if (iVar1 != -1) {
      __assert_fail("iObj == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x15f,
                    "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
    }
  }
  iVar1 = Bac_NtkObjNum(pNtk);
  iVar2 = Vec_StrCap(&pNtk->vType);
  if (iVar1 == iVar2) {
    return 1;
  }
  __assert_fail("Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x160,
                "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Bac_NtkDeriveFromPtr( Bac_Ntk_t * pNtk, Vec_Ptr_t * vNtk, Vec_Int_t * vMap, Vec_Int_t * vBox2Id )
{
    char * pName, * pModuleName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4), * vBox;
    int i, k, iObj, iTerm, NameId;
    // start network with the given name
    NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pModuleName, NULL );
    assert( Bac_NtkNameId(pNtk) == NameId );
    // map driven NameIds into their ObjIds for PIs
    Vec_PtrForEachEntry( char *, vInputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
            { printf( "PI with name \"%s\" is not unique module \"%s\".\n", pName, pModuleName ); return 0; }
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntSetEntryFull( vMap, NameId, iObj );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 1), -1, -1 );
    }
    // map driven NameIds into their ObjIds for BOs
    Vec_IntClear( vBox2Id );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        char * pBoxNtk = (char *)Vec_PtrEntry(vBox, 0);
        char * pBoxName = (char *)Vec_PtrEntry(vBox, 1);
        int nOutputs = Bac_BoxCountOutputs( pNtk, pBoxNtk );
        int nInputs = Vec_PtrSize(vBox)/2 - nOutputs - 1;
        int NtkId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
        assert( Vec_PtrSize(vBox) % 2 == 0 );
        assert( nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox) );
        iObj = Bac_BoxAlloc( pNtk, (Bac_ObjType_t)Ptr_NameToType(pBoxNtk), nInputs, nOutputs, NtkId );
        if ( NtkId > 0 )
            Bac_NtkSetHost( Bac_ManNtk(pNtk->pDesign, NtkId), Bac_NtkId(pNtk), iObj );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs, pBoxName, NULL), BAC_NAME_BIN) );
        Bac_BoxForEachBo( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, Vec_PtrSize(vBox) - 2*(nOutputs - k) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
                { printf( "Signal \"%s\" has multiple drivers in module \"%s\".\n", pName, pModuleName ); return 0; }
            Bac_ObjSetName( pNtk, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntSetEntryFull( vMap, NameId, iTerm );
        }
        Vec_IntPush( vBox2Id, iObj );
    }
    assert( Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes) );
    // connect BIs
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Id, i );
        Bac_BoxForEachBi( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, 2*(k + 1) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
                printf( "Signal \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
            Bac_ObjSetFanin( pNtk, iTerm, Vec_IntGetEntryFull(vMap, NameId) );
        }
    }
    // connect POs
    Vec_PtrForEachEntry( char *, vOutputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
            printf( "PO with name \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PO, Vec_IntGetEntryFull(vMap, NameId) );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 2), -1, -1 );
    }
    // update map
    Bac_NtkForEachCi( pNtk, iObj )
        Vec_IntSetEntryFull( vMap, Bac_ObjNameId(pNtk, iObj), -1 );
    // double check
    Vec_IntForEachEntry( vMap, iObj, i )
        assert( iObj == -1 );
    assert( Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType) );
    return 1;
}